

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void picked_container(obj *obj)

{
  obj *local_18;
  obj *otmp;
  obj *obj_local;
  
  for (local_18 = obj->cobj; local_18 != (obj *)0x0; local_18 = local_18->nobj) {
    if (local_18->oclass != '\f') {
      if ((*(uint *)&local_18->field_0x4a >> 3 & 1) != 0) {
        *(uint *)&local_18->field_0x4a = *(uint *)&local_18->field_0x4a & 0xfffffff7;
      }
      if (local_18->cobj != (obj *)0x0) {
        picked_container(local_18);
      }
    }
  }
  return;
}

Assistant:

void picked_container(struct obj *obj)
{
	struct obj *otmp;

	/* the "top" container is treated in the calling fn */
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
	    if (otmp->oclass == COIN_CLASS) continue;

	    if (otmp->no_charge)
		otmp->no_charge = 0;

	    if (Has_contents(otmp))
		picked_container(otmp);
	}
}